

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

void __thiscall
helics::CloneOperator::CloneOperator
          (CloneOperator *this,
          function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
          *userCloneFunction)

{
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)&PTR__CloneOperator_004d8ad0;
  std::
  function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
  ::function(&this->evalFunction,userCloneFunction);
  return;
}

Assistant:

CloneOperator::CloneOperator(
    std::function<std::vector<std::unique_ptr<Message>>(const Message*)> userCloneFunction):
    evalFunction(std::move(userCloneFunction))
{
}